

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Maybe<capnp::EnumSchema::Enumerant> * __thiscall
capnp::DynamicEnum::getEnumerant
          (Maybe<capnp::EnumSchema::Enumerant> *__return_storage_ptr__,DynamicEnum *this)

{
  bool bVar1;
  EnumerantList enumerants;
  EnumerantList local_50;
  
  EnumSchema::getEnumerants(&local_50,&this->schema);
  bVar1 = this->value < local_50.list.reader.elementCount;
  if (bVar1) {
    EnumSchema::EnumerantList::operator[]
              (&(__return_storage_ptr__->ptr).field_1.value,&local_50,(uint)this->value);
  }
  (__return_storage_ptr__->ptr).isSet = bVar1;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<EnumSchema::Enumerant> DynamicEnum::getEnumerant() const {
  auto enumerants = schema.getEnumerants();
  if (value < enumerants.size()) {
    return enumerants[value];
  } else {
    return kj::none;
  }
}